

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b0fca::BuildContext::processHadError
          (BuildContext *this,ProcessContext *param_1,ProcessHandle param_2,Twine *message)

{
  string local_30;
  
  llvm::Twine::str_abi_cxx11_(&local_30,message);
  emitError(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void processHadError(ProcessContext*, ProcessHandle,
                       const Twine& message) override {
    emitError(message.str());
  }